

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateConditional(ExpressionTranslateContext *ctx,ExprConditional *expression)

{
  Print(ctx,"(");
  Translate(ctx,expression->condition);
  Print(ctx,") ? (");
  Translate(ctx,expression->trueBlock);
  Print(ctx,") : (");
  Translate(ctx,expression->falseBlock);
  Print(ctx,")");
  return;
}

Assistant:

void TranslateConditional(ExpressionTranslateContext &ctx, ExprConditional *expression)
{
	Print(ctx, "(");
	Translate(ctx, expression->condition);
	Print(ctx, ") ? (");
	Translate(ctx, expression->trueBlock);
	Print(ctx, ") : (");
	Translate(ctx, expression->falseBlock);
	Print(ctx, ")");
}